

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  long lVar1;
  char cVar2;
  uint32_t uVar3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec;
  value_type *ppEVar4;
  Expression *pEVar5;
  iterator __it;
  mapped_type *pmVar6;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  key_type local_58;
  Expression *curr_1;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  code *local_30;
  
  uVar3 = Random::upTo((Random *)(*(long *)((long)this + 0xe8) + 0x10),10);
  if (uVar3 == 0) {
    cVar2 = wasm::Type::isDefaultable();
    if (cVar2 != '\0') {
      cVar2 = wasm::EHUtils::containsValidDanglingPop(curr);
      if (cVar2 == '\0') {
        vec = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                            *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
        if ((vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start ==
            (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("!candidates.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0x30d,
                        "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                       );
        }
        ppEVar4 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            ((Random *)(*(long *)((long)this + 0xe8) + 0x10),vec);
        local_48 = 0;
        uStack_40 = 0;
        local_30 = std::
                   _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
                   ::_M_invoke;
        local_38 = std::
                   _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h:72:15)>
                   ::_M_manager;
        pEVar5 = (Expression *)
                 wasm::ExpressionManipulator::flexibleCopy
                           (*ppEVar4,*(undefined8 *)((long)this + 0xd8));
        if (local_38 != (code *)0x0) {
          (*local_38)(&local_48,&local_48,3);
        }
        lVar1 = *(long *)((long)this + 200);
        if ((lVar1 != 0) && (*(long *)(lVar1 + 0xf8) != 0)) {
          this_00 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(lVar1 + 0xe0);
          local_58 = (key_type)**this;
          curr_1 = pEVar5;
          __it = std::
                 _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(this_00,&local_58);
          if (__it.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
              ._M_cur != (__node_type *)0x0) {
            uStack_40 = CONCAT44(uStack_40._4_4_,
                                 *(undefined4 *)
                                  ((long)__it.
                                         super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                                         ._M_cur + 0x18));
            local_48 = *(undefined8 *)
                        ((long)__it.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                               ._M_cur + 0x10);
            std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(this_00,(const_iterator)
                            __it.
                            super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                            ._M_cur);
            pmVar6 = std::__detail::
                     _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_00,&curr_1);
            pmVar6->columnNumber = (BinaryLocation)uStack_40;
            pmVar6->fileIndex = (undefined4)local_48;
            pmVar6->lineNumber = local_48._4_4_;
            pEVar5 = curr_1;
          }
        }
        **this = pEVar5;
      }
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }